

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O3

w_status wp_log_va(w_log_lvl lvl,char *file,int line,char *msg,__va_list_tag *args)

{
  bool bVar1;
  int iVar2;
  w_status wVar3;
  w_status wVar4;
  long lVar5;
  
  if (W_LOG_LVL_ALL < lvl) {
    w_handle_failed_assertion
              ("lvl >= 0 && lvl < WP_LOG_LVL_END","wp_log_va",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/log.c"
               ,0xe3);
  }
  if (file == (char *)0x0) {
    w_handle_failed_assertion
              ("file != NULL","wp_log_va",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/log.c"
               ,0xe4);
  }
  if (msg == (char *)0x0) {
    w_handle_failed_assertion
              ("msg != NULL","wp_log_va",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/log.c"
               ,0xe5);
  }
  iVar2 = w_mtx_lock(&wp_log_mtx);
  wVar4 = W_ERROR_LOCK_FAILED;
  if (iVar2 == 0) {
    if (wp_log_va_initialized == '\0') {
      wp_log_is_std_err_console = w_is_console(_stderr);
      wp_log_va_initialized = '\x01';
    }
    bVar1 = false;
    lVar5 = 0x14;
    do {
      if ((*(int *)((long)&wp_log_logger_pool[0].stream + lVar5) != 0) &&
         (lvl <= *(w_log_lvl *)(lVar5 + 0x108184))) {
        if (*(uint *)(lVar5 + 0x108188) < 2) {
          wVar3 = wp_log_fmt_plain(*(w_stream *)((long)&wp_log_mtx + lVar5 + 0x24),lvl,file,line,
                                   *(uint *)(lVar5 + 0x108188),msg,args);
          bVar1 = true;
          if (wVar3 != W_SUCCESS) goto LAB_00104080;
        }
        else {
          w_handle_failed_assertion
                    ("0","wp_log_va",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/log.c"
                     ,0x10b);
          bVar1 = true;
        }
      }
      lVar5 = lVar5 + 0x18;
    } while (lVar5 != 0xd4);
    wVar3 = W_SUCCESS;
    if (!bVar1) {
      wVar3 = wp_log_fmt_plain(_stderr,lvl,file,line,wp_log_is_std_err_console,msg,args);
    }
LAB_00104080:
    iVar2 = w_mtx_unlock(&wp_log_mtx);
    wVar4 = W_ERROR_UNLOCK_FAILED;
    if (iVar2 == 0) {
      wVar4 = wVar3;
    }
  }
  return wVar4;
}

Assistant:

enum w_status
wp_log_va(
    enum w_log_lvl lvl,
    const char *file,
    int line,
    const char *msg,
    va_list args
)
{
    static int32_t initialized = 0;

    enum w_status status;
    uint16_t i;
    int has_registered_logger;

    W_ASSERT(lvl >= 0 && lvl < WP_LOG_LVL_END);
    W_ASSERT(file != NULL);
    W_ASSERT(msg != NULL);

    if (w_mtx_lock(&wp_log_mtx) != 0)
    {
        return W_ERROR_LOCK_FAILED;
    }

    if (!initialized)
    {
        wp_log_is_std_err_console = w_is_console(W_STD_ERR);
        initialized = 1;
    }

    has_registered_logger = 0;
    for (i = 0; i < W_GET_ARRAY_LEN(wp_log_logger_pool); ++i)
    {
        struct wp_log_logger *logger;

        logger = &wp_log_logger_pool[i];
        if (!logger->valid || (logger->lvl < lvl))
        {
            continue;
        }

        has_registered_logger = 1;
        switch (logger->fmt)
        {
            case W_LOG_FMT_PLAIN:
                status = wp_log_fmt_plain(
                    logger->stream, lvl, file, line, 0, msg, args
                );
                break;
            case W_LOG_FMT_PLAIN_STYLIZED:
                status = wp_log_fmt_plain(
                    logger->stream, lvl, file, line, 1, msg, args
                );
                break;
            default:
                W_ASSERT(0);
        }

        if (status != W_SUCCESS)
        {
            goto exit;
        }
    }

    // Fallback to a default logger if none was explicitly registered.
    if (!has_registered_logger)
    {
        status = wp_log_fmt_plain(
            W_STD_ERR,
            lvl,
            file,
            line,
            wp_log_is_std_err_console,
            msg,
            args
        );

        if (status != W_SUCCESS)
        {
            goto exit;
        }
    }

exit:
    if (w_mtx_unlock(&wp_log_mtx) != 0)
    {
        status = W_ERROR_UNLOCK_FAILED;
    }

    return status;
}